

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Ptr * __thiscall
spectest::CommandRunner::ReadModule
          (Ptr *__return_storage_ptr__,CommandRunner *this,string_view module_filename,
          Errors *errors)

{
  bool bVar1;
  Result result;
  pointer pFVar2;
  uchar *data;
  size_type size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data;
  string_view filename;
  ModuleDesc local_2d0;
  Enum local_1ac;
  undefined1 local_1a8 [8];
  ModuleDesc module_desc;
  ReadBinaryOptions options;
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors *errors_local;
  CommandRunner *this_local;
  string_view module_filename_local;
  
  out_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)module_filename.size_;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)errors;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  filename.size_ = (size_type)local_48;
  filename.data_ = (char *)module_filename.size_;
  result = wabt::ReadFile((wabt *)module_filename.data_,filename,out_data);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    wabt::interp::RefPtr<wabt::interp::Module>::RefPtr(__return_storage_ptr__);
  }
  else {
    pFVar2 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                       (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)
               &module_desc.istream.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&s_features,&pFVar2->super_Stream,true,
               true,true);
    wabt::interp::ModuleDesc::ModuleDesc((ModuleDesc *)local_1a8);
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    local_1ac = (Enum)wabt::interp::ReadBinaryInterp
                                (data,size,
                                 (ReadBinaryOptions *)
                                 &module_desc.istream.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Errors *)
                                 file_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ModuleDesc *)local_1a8);
    bVar1 = wabt::Failed((Result)local_1ac);
    if (bVar1) {
      wabt::interp::RefPtr<wabt::interp::Module>::RefPtr(__return_storage_ptr__);
    }
    else {
      if (s_verbose != 0) {
        pFVar2 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_stdout_stream);
        wabt::interp::Istream::Disassemble
                  ((Istream *)
                   &module_desc.datas.
                    super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&pFVar2->super_Stream);
      }
      wabt::interp::ModuleDesc::ModuleDesc(&local_2d0,(ModuleDesc *)local_1a8);
      wabt::interp::Module::New(__return_storage_ptr__,&this->store_,&local_2d0);
      wabt::interp::ModuleDesc::~ModuleDesc(&local_2d0);
    }
    wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)local_1a8);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

interp::Module::Ptr CommandRunner::ReadModule(string_view module_filename,
                                               Errors* errors) {
  std::vector<uint8_t> file_data;

  if (Failed(ReadFile(module_filename, &file_data))) {
    return {};
  }

  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  ModuleDesc module_desc;
  if (Failed(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                              errors, &module_desc))) {
    return {};
  }

  if (s_verbose) {
    module_desc.istream.Disassemble(s_stdout_stream.get());
  }

  return interp::Module::New(store_, module_desc);
}